

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLSSetMassUserData(void *arkode_mem,void *user_data)

{
  int iVar1;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLSSetMassUserData",&local_10,&local_18);
  if (iVar1 == 0) {
    if (local_18->mass != (ARKLsMassFn)0x0) {
      local_18->M_data = user_data;
    }
    local_18->P_data = user_data;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkLSSetMassUserData(void *arkode_mem, void* user_data)
{
  ARKodeMem     ark_mem;
  ARKLsMassMem  arkls_mem;
  int           retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSSetMassUserData",
                               &ark_mem, &arkls_mem);
  if (retval != ARKLS_SUCCESS) return(retval);

  /* Set data for mass matrix */
  if (arkls_mem->mass != NULL)
    arkls_mem->M_data = user_data;

  /* Data for Mtimes is set in arkLSSetMassTimes */

  /* Set data for Preconditioner */
  arkls_mem->P_data = user_data;

  return(ARKLS_SUCCESS);
}